

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O1

ssl_open_record_t
bssl::ssl_open_change_cipher_spec
          (SSL *ssl,size_t *out_consumed,uint8_t *out_alert,Span<unsigned_char> in)

{
  SSL3_STATE *pSVar1;
  ssl_open_record_t sVar2;
  ERR_SAVE_STATE *__p;
  
  *out_consumed = 0;
  if (ssl->s3->read_shutdown == ssl_shutdown_error) {
    ERR_restore_state((ssl->s3->read_error)._M_t.
                      super___uniq_ptr_impl<err_save_state_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_err_save_state_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_err_save_state_st_*,_false>._M_head_impl);
    *out_alert = '\0';
    sVar2 = ssl_open_record_error;
  }
  else {
    sVar2 = (*ssl->method->open_change_cipher_spec)(ssl,out_consumed,out_alert,in);
    if (sVar2 == ssl_open_record_error) {
      pSVar1 = ssl->s3;
      pSVar1->read_shutdown = ssl_shutdown_error;
      __p = ERR_save_state();
      std::__uniq_ptr_impl<err_save_state_st,_bssl::internal::Deleter>::reset
                ((__uniq_ptr_impl<err_save_state_st,_bssl::internal::Deleter> *)&pSVar1->read_error,
                 __p);
    }
  }
  return sVar2;
}

Assistant:

ssl_open_record_t ssl_open_change_cipher_spec(SSL *ssl, size_t *out_consumed,
                                              uint8_t *out_alert,
                                              Span<uint8_t> in) {
  *out_consumed = 0;
  if (!check_read_error(ssl)) {
    *out_alert = 0;
    return ssl_open_record_error;
  }
  auto ret =
      ssl->method->open_change_cipher_spec(ssl, out_consumed, out_alert, in);
  if (ret == ssl_open_record_error) {
    ssl_set_read_error(ssl);
  }
  return ret;
}